

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ValuesInIteratorRangeGenerator<unsigned_long>::Iterator::Iterator
          (Iterator *this,Iterator *other)

{
  long in_RSI;
  ParamIteratorInterface<unsigned_long> *in_RDI;
  
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)0x0;
  ParamIteratorInterface<unsigned_long>::ParamIteratorInterface(in_RDI);
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_001ceda8;
  in_RDI[1]._vptr_ParamIteratorInterface = *(_func_int ***)(in_RSI + 8);
  in_RDI[2]._vptr_ParamIteratorInterface = *(_func_int ***)(in_RSI + 0x10);
  scoped_ptr<const_unsigned_long>::scoped_ptr
            ((scoped_ptr<const_unsigned_long> *)(in_RDI + 3),(unsigned_long *)0x0);
  return;
}

Assistant:

Iterator(const Iterator& other)
          // The explicit constructor call suppresses a false warning
          // emitted by gcc when supplied with the -Wextra option.
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          iterator_(other.iterator_) {}